

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int whereLoopAddBtreeIndex
              (WhereLoopBuilder *pBuilder,SrcList_item *pSrc,Index *pProbe,LogEst nInMul)

{
  Parse *pParse_00;
  sqlite3 *db_00;
  WhereLoop *p;
  ushort uVar1;
  LogEst LVar2;
  short sVar3;
  int iVar4;
  WhereTerm *local_150;
  LogEst nIter;
  Expr *pExpr_1;
  tRowcnt nOut;
  int nEq;
  int iCol;
  int iStack_124;
  LogEst safetyMargin;
  LogEst logK;
  LogEst M;
  int i;
  Expr *pExpr;
  int nRecValid;
  int nIn;
  LogEst nOutUnadjusted;
  LogEst rCostIdx;
  WhereTerm *pWStack_108;
  u16 eOp;
  WhereTerm *pBtm;
  WhereTerm *pTop;
  int local_f0;
  LogEst rLogSize;
  LogEst rSize;
  int rc;
  LogEst saved_nOut;
  u32 saved_wsFlags;
  ushort local_dc;
  u16 saved_nSkip;
  u16 saved_nTop;
  u16 saved_nBtm;
  u16 saved_nEq;
  u16 saved_nLTerm;
  Bitmask saved_prereq;
  WhereScan scan;
  WhereTerm *pWStack_58;
  int opMask;
  WhereTerm *pTerm;
  WhereLoop *pNew;
  sqlite3 *db;
  Parse *pParse;
  WhereInfo *pWInfo;
  LogEst nInMul_local;
  Index *pProbe_local;
  SrcList_item *pSrc_local;
  WhereLoopBuilder *pBuilder_local;
  
  pParse_00 = pBuilder->pWInfo->pParse;
  db_00 = pParse_00->db;
  local_f0 = 0;
  pBtm = (WhereTerm *)0x0;
  pWStack_108 = (WhereTerm *)0x0;
  p = pBuilder->pNew;
  if (db_00->mallocFailed == '\0') {
    if ((p->wsFlags & 0x20) == 0) {
      scan.aiColumn[10] = 0x1bf;
      scan._110_2_ = 0;
    }
    else {
      scan.aiColumn[10] = 0x18;
      scan._110_2_ = 0;
    }
    if ((*(ushort *)&pProbe->field_0x63 >> 2 & 1) != 0) {
      scan._108_4_ = scan._108_4_ & 0xffffffc3;
    }
    local_dc = (p->u).btree.nEq;
    saved_wsFlags._2_2_ = (p->u).btree.nBtm;
    saved_wsFlags._0_2_ = (p->u).btree.nTop;
    saved_nOut = p->nSkip;
    saved_nSkip = p->nLTerm;
    rc = p->wsFlags;
    _saved_nTop = p->prereq;
    rSize = p->nOut;
    pWStack_58 = whereScanInit((WhereScan *)&saved_prereq,pBuilder->pWC,pSrc->iCursor,(uint)local_dc
                               ,scan._108_4_,pProbe);
    p->rSetup = 0;
    pTop._6_2_ = *pProbe->aiRowLogEst;
    pTop._4_2_ = estLog(pTop._6_2_);
    while (local_f0 == 0 && pWStack_58 != (WhereTerm *)0x0) {
      nIn._2_2_ = pWStack_58->eOperator;
      pExpr._4_4_ = 0;
      pExpr._0_4_ = pBuilder->nRecValid;
      if ((((((nIn._2_2_ != 0x100) && ((pWStack_58->wtFlags & 0x80) == 0)) ||
            (iVar4 = indexColumnNotNull(pProbe,(uint)local_dc), iVar4 == 0)) &&
           ((pWStack_58->prereqRight & p->maskSelf) == 0)) &&
          (((pWStack_58->wtFlags & 0x100) == 0 || (pWStack_58->eOperator != 0x10)))) &&
         ((((pSrc->fg).jointype & 8) == 0 || ((pWStack_58->pExpr->flags & 1) != 0)))) {
        if ((pProbe->onError == '\0') || ((uint)local_dc != pProbe->nKeyCol - 1)) {
          pBuilder->bldFlags = pBuilder->bldFlags | 1;
        }
        else {
          pBuilder->bldFlags = pBuilder->bldFlags | 2;
        }
        p->wsFlags = rc;
        (p->u).btree.nEq = local_dc;
        (p->u).btree.nBtm = saved_wsFlags._2_2_;
        (p->u).btree.nTop = (u16)saved_wsFlags;
        p->nLTerm = saved_nSkip;
        iVar4 = whereLoopResize(db_00,p,p->nLTerm + 1);
        if (iVar4 != 0) break;
        uVar1 = p->nLTerm;
        p->nLTerm = uVar1 + 1;
        p->aLTerm[uVar1] = pWStack_58;
        p->prereq = (_saved_nTop | pWStack_58->prereqRight) & (p->maskSelf ^ 0xffffffffffffffff);
        if ((nIn._2_2_ & 1) == 0) {
          if ((nIn._2_2_ & 0x82) == 0) {
            if ((nIn._2_2_ & 0x100) == 0) {
              if ((nIn._2_2_ & 0x24) == 0) {
                p->wsFlags = p->wsFlags | 0x12;
                iVar4 = whereRangeVectorLen(pParse_00,pSrc->iCursor,pProbe,(uint)local_dc,pWStack_58
                                           );
                (p->u).btree.nTop = (u16)iVar4;
                pBtm = pWStack_58;
                if ((p->wsFlags & 0x20) == 0) {
                  local_150 = (WhereTerm *)0x0;
                }
                else {
                  local_150 = p->aLTerm[(int)(p->nLTerm - 2)];
                }
                pWStack_108 = local_150;
              }
              else {
                p->wsFlags = p->wsFlags | 0x22;
                iVar4 = whereRangeVectorLen(pParse_00,pSrc->iCursor,pProbe,(uint)local_dc,pWStack_58
                                           );
                (p->u).btree.nBtm = (u16)iVar4;
                pWStack_108 = pWStack_58;
                pBtm = (WhereTerm *)0x0;
                if ((pWStack_58->wtFlags & 0x100) != 0) {
                  pBtm = pWStack_58 + 1;
                  iVar4 = whereLoopResize(db_00,p,p->nLTerm + 1);
                  if (iVar4 != 0) break;
                  uVar1 = p->nLTerm;
                  p->nLTerm = uVar1 + 1;
                  p->aLTerm[uVar1] = pBtm;
                  p->wsFlags = p->wsFlags | 0x10;
                  (p->u).btree.nTop = 1;
                }
              }
            }
            else {
              p->wsFlags = p->wsFlags | 8;
            }
          }
          else {
            nOut = (tRowcnt)pProbe->aiColumn[local_dc];
            p->wsFlags = p->wsFlags | 1;
            if ((nOut == 0xffffffff) ||
               (((-1 < (int)nOut && (nInMul == 0)) && ((uint)local_dc == pProbe->nKeyCol - 1)))) {
              if (((nOut == 0xffffffff) || ((*(ushort *)&pProbe->field_0x63 >> 3 & 1) != 0)) ||
                 ((pProbe->nKeyCol == 1 && ((pProbe->onError != '\0' && (nIn._2_2_ == 2)))))) {
                p->wsFlags = p->wsFlags | 0x1000;
              }
              else {
                p->wsFlags = p->wsFlags | 0x10000;
              }
            }
          }
        }
        else {
          _logK = pWStack_58->pExpr;
          if ((_logK->flags & 0x800) == 0) {
            if (((_logK->x).pList != (ExprList *)0x0) && (((_logK->x).pList)->nExpr != 0)) {
              LVar2 = sqlite3LogEst((long)((_logK->x).pList)->nExpr);
              pExpr._4_4_ = (int)LVar2;
            }
          }
          else {
            pExpr._4_4_ = 0x2e;
            for (iStack_124 = 0; iStack_124 < (int)(p->nLTerm - 1); iStack_124 = iStack_124 + 1) {
              if ((p->aLTerm[iStack_124] != (WhereTerm *)0x0) &&
                 (p->aLTerm[iStack_124]->pExpr == _logK)) {
                pExpr._4_4_ = 0;
              }
            }
          }
          if ((*(ushort *)&pProbe->field_0x63 >> 7 & 1) != 0) {
            iCol._2_2_ = pProbe->aiRowLogEst[local_dc];
            iCol._0_2_ = estLog((LogEst)pExpr._4_4_);
            nEq._2_2_ = 10;
            if ((int)iCol._2_2_ + (int)(LogEst)iCol + 10 < pExpr._4_4_ + pTop._4_2_)
            goto LAB_001b3184;
          }
          p->wsFlags = p->wsFlags | 4;
        }
        if ((p->wsFlags & 2) == 0) {
          uVar1 = (p->u).btree.nEq + 1;
          (p->u).btree.nEq = uVar1;
          pExpr_1._4_4_ = (uint)uVar1;
          if ((pWStack_58->truthProb < 1) && (-1 < pProbe->aiColumn[local_dc])) {
            p->nOut = p->nOut + pWStack_58->truthProb;
            p->nOut = p->nOut - (short)pExpr._4_4_;
          }
          else {
            pExpr_1._0_4_ = 0;
            if ((((nInMul == 0) &&
                 ((pProbe->nSample != 0 && ((int)(uint)(p->u).btree.nEq <= pProbe->nSampleCol)))) &&
                (((nIn._2_2_ & 1) == 0 || ((pWStack_58->pExpr->flags & 0x800) == 0)))) &&
               ((db_00->dbOptFlags & 0x800) == 0)) {
              if ((nIn._2_2_ & 0x182) == 0) {
                local_f0 = whereInScanEst(pParse_00,pBuilder,(pWStack_58->pExpr->x).pList,
                                          (tRowcnt *)&pExpr_1);
              }
              else {
                local_f0 = whereEqualScanEst(pParse_00,pBuilder,pWStack_58->pExpr->pRight,
                                             (tRowcnt *)&pExpr_1);
              }
              if (local_f0 == 0xc) {
                local_f0 = 0;
              }
              if (local_f0 != 0) break;
              if ((uint)pExpr_1 != 0) {
                LVar2 = sqlite3LogEst((ulong)(uint)pExpr_1);
                p->nOut = LVar2;
                if (rSize < p->nOut) {
                  p->nOut = rSize;
                }
                p->nOut = p->nOut - (short)pExpr._4_4_;
              }
            }
            if (((uint)pExpr_1 == 0) &&
               (p->nOut = p->nOut + (pProbe->aiRowLogEst[(int)pExpr_1._4_4_] -
                                    pProbe->aiRowLogEst[(int)(pExpr_1._4_4_ - 1)]),
               (nIn._2_2_ & 0x100) != 0)) {
              p->nOut = p->nOut + 10;
            }
          }
        }
        else {
          whereRangeScanEst(pParse_00,pBuilder,pWStack_108,pBtm,p);
        }
        nIn._0_2_ = p->nOut + 1 + (short)((pProbe->szIdxRow * 0xf) / (int)pSrc->pTab->szTabRow);
        LVar2 = sqlite3LogEstAdd(pTop._4_2_,(short)nIn);
        p->rRun = LVar2;
        if ((p->wsFlags & 0x140) == 0) {
          LVar2 = sqlite3LogEstAdd(p->rRun,p->nOut + 0x10);
          p->rRun = LVar2;
        }
        nRecValid._2_2_ = p->nOut;
        p->rRun = p->rRun + nInMul + (short)pExpr._4_4_;
        p->nOut = p->nOut + nInMul + (short)pExpr._4_4_;
        whereLoopOutputAdjust(pBuilder->pWC,p,pTop._6_2_);
        local_f0 = whereLoopInsert(pBuilder,p);
        if ((p->wsFlags & 2) == 0) {
          p->nOut = nRecValid._2_2_;
        }
        else {
          p->nOut = rSize;
        }
        if (((p->wsFlags & 0x10) == 0) && ((p->u).btree.nEq < pProbe->nColumn)) {
          whereLoopAddBtreeIndex(pBuilder,pSrc,pProbe,nInMul + (short)pExpr._4_4_);
        }
        p->nOut = rSize;
        pBuilder->nRecValid = (int)pExpr;
      }
LAB_001b3184:
      pWStack_58 = whereScanNext((WhereScan *)&saved_prereq);
    }
    p->prereq = _saved_nTop;
    (p->u).btree.nEq = local_dc;
    (p->u).btree.nBtm = saved_wsFlags._2_2_;
    (p->u).btree.nTop = (u16)saved_wsFlags;
    p->nSkip = saved_nOut;
    p->wsFlags = rc;
    p->nOut = rSize;
    p->nLTerm = saved_nSkip;
    if ((((local_dc == saved_nOut) && (local_dc + 1 < (uint)pProbe->nKeyCol)) &&
        ((*(ushort *)&pProbe->field_0x63 >> 6 & 1) == 0)) &&
       ((((db_00->dbOptFlags & 0x4000) == 0 && (0x29 < pProbe->aiRowLogEst[(int)(local_dc + 1)])) &&
        (local_f0 = whereLoopResize(db_00,p,p->nLTerm + 1), local_f0 == 0)))) {
      (p->u).btree.nEq = (p->u).btree.nEq + 1;
      p->nSkip = p->nSkip + 1;
      uVar1 = p->nLTerm;
      p->nLTerm = uVar1 + 1;
      p->aLTerm[uVar1] = (WhereTerm *)0x0;
      p->wsFlags = p->wsFlags | 0x8000;
      sVar3 = pProbe->aiRowLogEst[local_dc] - pProbe->aiRowLogEst[(int)(local_dc + 1)];
      p->nOut = p->nOut - sVar3;
      whereLoopAddBtreeIndex(pBuilder,pSrc,pProbe,sVar3 + 5 + nInMul);
      p->nOut = rSize;
      (p->u).btree.nEq = local_dc;
      p->nSkip = saved_nOut;
      p->wsFlags = rc;
    }
    pBuilder_local._4_4_ = local_f0;
  }
  else {
    pBuilder_local._4_4_ = 7;
  }
  return pBuilder_local._4_4_;
}

Assistant:

static int whereLoopAddBtreeIndex(
  WhereLoopBuilder *pBuilder,     /* The WhereLoop factory */
  struct SrcList_item *pSrc,      /* FROM clause term being analyzed */
  Index *pProbe,                  /* An index on pSrc */
  LogEst nInMul                   /* log(Number of iterations due to IN) */
){
  WhereInfo *pWInfo = pBuilder->pWInfo;  /* WHERE analyse context */
  Parse *pParse = pWInfo->pParse;        /* Parsing context */
  sqlite3 *db = pParse->db;       /* Database connection malloc context */
  WhereLoop *pNew;                /* Template WhereLoop under construction */
  WhereTerm *pTerm;               /* A WhereTerm under consideration */
  int opMask;                     /* Valid operators for constraints */
  WhereScan scan;                 /* Iterator for WHERE terms */
  Bitmask saved_prereq;           /* Original value of pNew->prereq */
  u16 saved_nLTerm;               /* Original value of pNew->nLTerm */
  u16 saved_nEq;                  /* Original value of pNew->u.btree.nEq */
  u16 saved_nBtm;                 /* Original value of pNew->u.btree.nBtm */
  u16 saved_nTop;                 /* Original value of pNew->u.btree.nTop */
  u16 saved_nSkip;                /* Original value of pNew->nSkip */
  u32 saved_wsFlags;              /* Original value of pNew->wsFlags */
  LogEst saved_nOut;              /* Original value of pNew->nOut */
  int rc = SQLITE_OK;             /* Return code */
  LogEst rSize;                   /* Number of rows in the table */
  LogEst rLogSize;                /* Logarithm of table size */
  WhereTerm *pTop = 0, *pBtm = 0; /* Top and bottom range constraints */

  pNew = pBuilder->pNew;
  if( db->mallocFailed ) return SQLITE_NOMEM_BKPT;
  WHERETRACE(0x800, ("BEGIN %s.addBtreeIdx(%s), nEq=%d\n",
                     pProbe->pTable->zName,pProbe->zName, pNew->u.btree.nEq));

  assert( (pNew->wsFlags & WHERE_VIRTUALTABLE)==0 );
  assert( (pNew->wsFlags & WHERE_TOP_LIMIT)==0 );
  if( pNew->wsFlags & WHERE_BTM_LIMIT ){
    opMask = WO_LT|WO_LE;
  }else{
    assert( pNew->u.btree.nBtm==0 );
    opMask = WO_EQ|WO_IN|WO_GT|WO_GE|WO_LT|WO_LE|WO_ISNULL|WO_IS;
  }
  if( pProbe->bUnordered ) opMask &= ~(WO_GT|WO_GE|WO_LT|WO_LE);

  assert( pNew->u.btree.nEq<pProbe->nColumn );

  saved_nEq = pNew->u.btree.nEq;
  saved_nBtm = pNew->u.btree.nBtm;
  saved_nTop = pNew->u.btree.nTop;
  saved_nSkip = pNew->nSkip;
  saved_nLTerm = pNew->nLTerm;
  saved_wsFlags = pNew->wsFlags;
  saved_prereq = pNew->prereq;
  saved_nOut = pNew->nOut;
  pTerm = whereScanInit(&scan, pBuilder->pWC, pSrc->iCursor, saved_nEq,
                        opMask, pProbe);
  pNew->rSetup = 0;
  rSize = pProbe->aiRowLogEst[0];
  rLogSize = estLog(rSize);
  for(; rc==SQLITE_OK && pTerm!=0; pTerm = whereScanNext(&scan)){
    u16 eOp = pTerm->eOperator;   /* Shorthand for pTerm->eOperator */
    LogEst rCostIdx;
    LogEst nOutUnadjusted;        /* nOut before IN() and WHERE adjustments */
    int nIn = 0;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    int nRecValid = pBuilder->nRecValid;
#endif
    if( (eOp==WO_ISNULL || (pTerm->wtFlags&TERM_VNULL)!=0)
     && indexColumnNotNull(pProbe, saved_nEq)
    ){
      continue; /* ignore IS [NOT] NULL constraints on NOT NULL columns */
    }
    if( pTerm->prereqRight & pNew->maskSelf ) continue;

    /* Do not allow the upper bound of a LIKE optimization range constraint
    ** to mix with a lower range bound from some other source */
    if( pTerm->wtFlags & TERM_LIKEOPT && pTerm->eOperator==WO_LT ) continue;

    /* Do not allow constraints from the WHERE clause to be used by the
    ** right table of a LEFT JOIN.  Only constraints in the ON clause are
    ** allowed */
    if( (pSrc->fg.jointype & JT_LEFT)!=0
     && !ExprHasProperty(pTerm->pExpr, EP_FromJoin)
    ){
      continue;
    }

    if( IsUniqueIndex(pProbe) && saved_nEq==pProbe->nKeyCol-1 ){
      pBuilder->bldFlags |= SQLITE_BLDF_UNIQUE;
    }else{
      pBuilder->bldFlags |= SQLITE_BLDF_INDEXED;
    }
    pNew->wsFlags = saved_wsFlags;
    pNew->u.btree.nEq = saved_nEq;
    pNew->u.btree.nBtm = saved_nBtm;
    pNew->u.btree.nTop = saved_nTop;
    pNew->nLTerm = saved_nLTerm;
    if( whereLoopResize(db, pNew, pNew->nLTerm+1) ) break; /* OOM */
    pNew->aLTerm[pNew->nLTerm++] = pTerm;
    pNew->prereq = (saved_prereq | pTerm->prereqRight) & ~pNew->maskSelf;

    assert( nInMul==0
        || (pNew->wsFlags & WHERE_COLUMN_NULL)!=0 
        || (pNew->wsFlags & WHERE_COLUMN_IN)!=0 
        || (pNew->wsFlags & WHERE_SKIPSCAN)!=0 
    );

    if( eOp & WO_IN ){
      Expr *pExpr = pTerm->pExpr;
      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        /* "x IN (SELECT ...)":  TUNING: the SELECT returns 25 rows */
        int i;
        nIn = 46;  assert( 46==sqlite3LogEst(25) );

        /* The expression may actually be of the form (x, y) IN (SELECT...).
        ** In this case there is a separate term for each of (x) and (y).
        ** However, the nIn multiplier should only be applied once, not once
        ** for each such term. The following loop checks that pTerm is the
        ** first such term in use, and sets nIn back to 0 if it is not. */
        for(i=0; i<pNew->nLTerm-1; i++){
          if( pNew->aLTerm[i] && pNew->aLTerm[i]->pExpr==pExpr ) nIn = 0;
        }
      }else if( ALWAYS(pExpr->x.pList && pExpr->x.pList->nExpr) ){
        /* "x IN (value, value, ...)" */
        nIn = sqlite3LogEst(pExpr->x.pList->nExpr);
        assert( nIn>0 );  /* RHS always has 2 or more terms...  The parser
                          ** changes "x IN (?)" into "x=?". */
      }
      if( pProbe->hasStat1 ){
        LogEst M, logK, safetyMargin;
        /* Let:
        **   N = the total number of rows in the table
        **   K = the number of entries on the RHS of the IN operator
        **   M = the number of rows in the table that match terms to the 
        **       to the left in the same index.  If the IN operator is on
        **       the left-most index column, M==N.
        **
        ** Given the definitions above, it is better to omit the IN operator
        ** from the index lookup and instead do a scan of the M elements,
        ** testing each scanned row against the IN operator separately, if:
        **
        **        M*log(K) < K*log(N)
        **
        ** Our estimates for M, K, and N might be inaccurate, so we build in
        ** a safety margin of 2 (LogEst: 10) that favors using the IN operator
        ** with the index, as using an index has better worst-case behavior.
        ** If we do not have real sqlite_stat1 data, always prefer to use
        ** the index.
        */
        M = pProbe->aiRowLogEst[saved_nEq];
        logK = estLog(nIn);
        safetyMargin = 10;  /* TUNING: extra weight for indexed IN */
        if( M + logK + safetyMargin < nIn + rLogSize ){
          WHERETRACE(0x40,
            ("Scan preferred over IN operator on column %d of \"%s\" (%d<%d)\n",
             saved_nEq, pProbe->zName, M+logK+10, nIn+rLogSize));
          continue;
        }else{
          WHERETRACE(0x40,
            ("IN operator preferred on column %d of \"%s\" (%d>=%d)\n",
             saved_nEq, pProbe->zName, M+logK+10, nIn+rLogSize));
        }
      }
      pNew->wsFlags |= WHERE_COLUMN_IN;
    }else if( eOp & (WO_EQ|WO_IS) ){
      int iCol = pProbe->aiColumn[saved_nEq];
      pNew->wsFlags |= WHERE_COLUMN_EQ;
      assert( saved_nEq==pNew->u.btree.nEq );
      if( iCol==XN_ROWID 
       || (iCol>=0 && nInMul==0 && saved_nEq==pProbe->nKeyCol-1)
      ){
        if( iCol==XN_ROWID || pProbe->uniqNotNull 
         || (pProbe->nKeyCol==1 && pProbe->onError && eOp==WO_EQ) 
        ){
          pNew->wsFlags |= WHERE_ONEROW;
        }else{
          pNew->wsFlags |= WHERE_UNQ_WANTED;
        }
      }
    }else if( eOp & WO_ISNULL ){
      pNew->wsFlags |= WHERE_COLUMN_NULL;
    }else if( eOp & (WO_GT|WO_GE) ){
      testcase( eOp & WO_GT );
      testcase( eOp & WO_GE );
      pNew->wsFlags |= WHERE_COLUMN_RANGE|WHERE_BTM_LIMIT;
      pNew->u.btree.nBtm = whereRangeVectorLen(
          pParse, pSrc->iCursor, pProbe, saved_nEq, pTerm
      );
      pBtm = pTerm;
      pTop = 0;
      if( pTerm->wtFlags & TERM_LIKEOPT ){
        /* Range contraints that come from the LIKE optimization are
        ** always used in pairs. */
        pTop = &pTerm[1];
        assert( (pTop-(pTerm->pWC->a))<pTerm->pWC->nTerm );
        assert( pTop->wtFlags & TERM_LIKEOPT );
        assert( pTop->eOperator==WO_LT );
        if( whereLoopResize(db, pNew, pNew->nLTerm+1) ) break; /* OOM */
        pNew->aLTerm[pNew->nLTerm++] = pTop;
        pNew->wsFlags |= WHERE_TOP_LIMIT;
        pNew->u.btree.nTop = 1;
      }
    }else{
      assert( eOp & (WO_LT|WO_LE) );
      testcase( eOp & WO_LT );
      testcase( eOp & WO_LE );
      pNew->wsFlags |= WHERE_COLUMN_RANGE|WHERE_TOP_LIMIT;
      pNew->u.btree.nTop = whereRangeVectorLen(
          pParse, pSrc->iCursor, pProbe, saved_nEq, pTerm
      );
      pTop = pTerm;
      pBtm = (pNew->wsFlags & WHERE_BTM_LIMIT)!=0 ?
                     pNew->aLTerm[pNew->nLTerm-2] : 0;
    }

    /* At this point pNew->nOut is set to the number of rows expected to
    ** be visited by the index scan before considering term pTerm, or the
    ** values of nIn and nInMul. In other words, assuming that all 
    ** "x IN(...)" terms are replaced with "x = ?". This block updates
    ** the value of pNew->nOut to account for pTerm (but not nIn/nInMul).  */
    assert( pNew->nOut==saved_nOut );
    if( pNew->wsFlags & WHERE_COLUMN_RANGE ){
      /* Adjust nOut using stat3/stat4 data. Or, if there is no stat3/stat4
      ** data, using some other estimate.  */
      whereRangeScanEst(pParse, pBuilder, pBtm, pTop, pNew);
    }else{
      int nEq = ++pNew->u.btree.nEq;
      assert( eOp & (WO_ISNULL|WO_EQ|WO_IN|WO_IS) );

      assert( pNew->nOut==saved_nOut );
      if( pTerm->truthProb<=0 && pProbe->aiColumn[saved_nEq]>=0 ){
        assert( (eOp & WO_IN) || nIn==0 );
        testcase( eOp & WO_IN );
        pNew->nOut += pTerm->truthProb;
        pNew->nOut -= nIn;
      }else{
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
        tRowcnt nOut = 0;
        if( nInMul==0 
         && pProbe->nSample 
         && pNew->u.btree.nEq<=pProbe->nSampleCol
         && ((eOp & WO_IN)==0 || !ExprHasProperty(pTerm->pExpr, EP_xIsSelect))
         && OptimizationEnabled(db, SQLITE_Stat34)
        ){
          Expr *pExpr = pTerm->pExpr;
          if( (eOp & (WO_EQ|WO_ISNULL|WO_IS))!=0 ){
            testcase( eOp & WO_EQ );
            testcase( eOp & WO_IS );
            testcase( eOp & WO_ISNULL );
            rc = whereEqualScanEst(pParse, pBuilder, pExpr->pRight, &nOut);
          }else{
            rc = whereInScanEst(pParse, pBuilder, pExpr->x.pList, &nOut);
          }
          if( rc==SQLITE_NOTFOUND ) rc = SQLITE_OK;
          if( rc!=SQLITE_OK ) break;          /* Jump out of the pTerm loop */
          if( nOut ){
            pNew->nOut = sqlite3LogEst(nOut);
            if( pNew->nOut>saved_nOut ) pNew->nOut = saved_nOut;
            pNew->nOut -= nIn;
          }
        }
        if( nOut==0 )
#endif
        {
          pNew->nOut += (pProbe->aiRowLogEst[nEq] - pProbe->aiRowLogEst[nEq-1]);
          if( eOp & WO_ISNULL ){
            /* TUNING: If there is no likelihood() value, assume that a 
            ** "col IS NULL" expression matches twice as many rows 
            ** as (col=?). */
            pNew->nOut += 10;
          }
        }
      }
    }

    /* Set rCostIdx to the cost of visiting selected rows in index. Add
    ** it to pNew->rRun, which is currently set to the cost of the index
    ** seek only. Then, if this is a non-covering index, add the cost of
    ** visiting the rows in the main table.  */
    rCostIdx = pNew->nOut + 1 + (15*pProbe->szIdxRow)/pSrc->pTab->szTabRow;
    pNew->rRun = sqlite3LogEstAdd(rLogSize, rCostIdx);
    if( (pNew->wsFlags & (WHERE_IDX_ONLY|WHERE_IPK))==0 ){
      pNew->rRun = sqlite3LogEstAdd(pNew->rRun, pNew->nOut + 16);
    }
    ApplyCostMultiplier(pNew->rRun, pProbe->pTable->costMult);

    nOutUnadjusted = pNew->nOut;
    pNew->rRun += nInMul + nIn;
    pNew->nOut += nInMul + nIn;
    whereLoopOutputAdjust(pBuilder->pWC, pNew, rSize);
    rc = whereLoopInsert(pBuilder, pNew);

    if( pNew->wsFlags & WHERE_COLUMN_RANGE ){
      pNew->nOut = saved_nOut;
    }else{
      pNew->nOut = nOutUnadjusted;
    }

    if( (pNew->wsFlags & WHERE_TOP_LIMIT)==0
     && pNew->u.btree.nEq<pProbe->nColumn
    ){
      whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, nInMul+nIn);
    }
    pNew->nOut = saved_nOut;
#ifdef SQLITE_ENABLE_STAT3_OR_STAT4
    pBuilder->nRecValid = nRecValid;
#endif
  }
  pNew->prereq = saved_prereq;
  pNew->u.btree.nEq = saved_nEq;
  pNew->u.btree.nBtm = saved_nBtm;
  pNew->u.btree.nTop = saved_nTop;
  pNew->nSkip = saved_nSkip;
  pNew->wsFlags = saved_wsFlags;
  pNew->nOut = saved_nOut;
  pNew->nLTerm = saved_nLTerm;

  /* Consider using a skip-scan if there are no WHERE clause constraints
  ** available for the left-most terms of the index, and if the average
  ** number of repeats in the left-most terms is at least 18. 
  **
  ** The magic number 18 is selected on the basis that scanning 17 rows
  ** is almost always quicker than an index seek (even though if the index
  ** contains fewer than 2^17 rows we assume otherwise in other parts of
  ** the code). And, even if it is not, it should not be too much slower. 
  ** On the other hand, the extra seeks could end up being significantly
  ** more expensive.  */
  assert( 42==sqlite3LogEst(18) );
  if( saved_nEq==saved_nSkip
   && saved_nEq+1<pProbe->nKeyCol
   && pProbe->noSkipScan==0
   && OptimizationEnabled(db, SQLITE_SkipScan)
   && pProbe->aiRowLogEst[saved_nEq+1]>=42  /* TUNING: Minimum for skip-scan */
   && (rc = whereLoopResize(db, pNew, pNew->nLTerm+1))==SQLITE_OK
  ){
    LogEst nIter;
    pNew->u.btree.nEq++;
    pNew->nSkip++;
    pNew->aLTerm[pNew->nLTerm++] = 0;
    pNew->wsFlags |= WHERE_SKIPSCAN;
    nIter = pProbe->aiRowLogEst[saved_nEq] - pProbe->aiRowLogEst[saved_nEq+1];
    pNew->nOut -= nIter;
    /* TUNING:  Because uncertainties in the estimates for skip-scan queries,
    ** add a 1.375 fudge factor to make skip-scan slightly less likely. */
    nIter += 5;
    whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, nIter + nInMul);
    pNew->nOut = saved_nOut;
    pNew->u.btree.nEq = saved_nEq;
    pNew->nSkip = saved_nSkip;
    pNew->wsFlags = saved_wsFlags;
  }

  WHERETRACE(0x800, ("END %s.addBtreeIdx(%s), nEq=%d, rc=%d\n",
                      pProbe->pTable->zName, pProbe->zName, saved_nEq, rc));
  return rc;
}